

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O3

long __thiscall
Alice::ObliviousTranslateSingleAddress
          (Alice *this,long addr,
          vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *Perm)

{
  long arg1;
  long lVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  string local_50;
  
  if ((Perm->super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
      _M_impl.super__Vector_impl_data._M_finish ==
      (Perm->super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    lVar1 = 0;
  }
  else {
    dVar3 = 0.0;
    lVar1 = 0;
    uVar2 = 0;
    do {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"==","");
      arg1 = ObliviousComparison(this,&local_50,addr,
                                 *(long *)((long)&((Perm->
                                                  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                          + lVar1));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      dVar4 = ObliviousMultiplication
                        (this,arg1,
                         *(long *)((long)&((Perm->
                                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->second +
                                  lVar1));
      dVar3 = dVar3 + dVar4;
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while (uVar2 < (ulong)((long)(Perm->
                                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(Perm->
                                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 4));
    lVar1 = (long)dVar3;
  }
  return lVar1;
}

Assistant:

long Alice::ObliviousTranslateSingleAddress(long addr, std::vector<std::pair<long,long>> Perm)
{
   double result = 0;
   long beta = 0;
   for(int i=0; i < Perm.size(); i++)
   {
       beta = ObliviousComparison("==", addr, Perm[i].first);
       result += ObliviousMultiplication(beta, Perm[i].second);
   } 
   return result;
}